

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicAtomicCase1::Run(BasicAtomicCase1 *this)

{
  bool bVar1;
  GLuint GVar2;
  int *piVar3;
  uint local_70;
  uint local_6c;
  int i_1;
  int i;
  long error;
  int *data;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  BasicAtomicCase1 *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 8) in;\nlayout(std430, binding = 0) buffer Output {\n  uint g_add_output[8];\n  int g_sub_output[8];\n};\nshared uint g_add_value;\nshared int g_sub_value;\nvoid main() {\n  if (gl_LocalInvocationIndex == 0u) {\n    g_add_value = 0u;\n    g_sub_value = 7;\n  }\n  g_add_output[gl_LocalInvocationIndex] = 0u;\n  g_sub_output[gl_LocalInvocationIndex] = 0;\n  groupMemoryBarrier();\n  barrier();\n  g_add_output[gl_LocalInvocationIndex] = atomicAdd(g_add_value, 1u);\n  g_sub_output[gl_LocalInvocationIndex] = atomicAdd(g_sub_value, -1);\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 8) in;\nlayout(std430, binding = 0) buffer Output {\n  uint g_add_output[8];\n  int g_sub_output[8];\n};\nshared uint g_add_value;\nshared int g_sub_value;\nvoid main() {\n  if (gl_LocalInvocationIndex == 0u) {\n    g_add_value = 0u;\n    g_sub_value = 7;\n  }\n  g_add_output[gl_LocalInvocationIndex] = 0u;\n  g_sub_output[gl_LocalInvocationIndex] = 0;\n  groupMemoryBarrier();\n  barrier();\n  g_add_output[gl_LocalInvocationIndex] = atomicAdd(g_add_value, 1u);\n  g_sub_output[gl_LocalInvocationIndex] = atomicAdd(g_sub_value, -1);\n}"
             ,&local_41);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0x40,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    piVar3 = (int *)glu::CallLogWrapper::glMapBufferRange
                              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                                super_CallLogWrapper,0x90d2,0,0x20,1);
    std::sort<int*>(piVar3,piVar3 + 8);
    _i_1 = (BasicAtomicCase1 *)0x0;
    for (local_6c = 0; (int)local_6c < 8; local_6c = local_6c + 1) {
      if (piVar3[(int)local_6c] != local_6c) {
        anon_unknown_0::Output
                  ("Data at index %d is %d should be %d.\n",(ulong)local_6c,
                   (ulong)(uint)piVar3[(int)local_6c],(ulong)local_6c);
        _i_1 = (BasicAtomicCase1 *)&DAT_ffffffffffffffff;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    piVar3 = (int *)glu::CallLogWrapper::glMapBufferRange
                              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                                super_CallLogWrapper,0x90d2,0x20,0x20,1);
    std::sort<int*>(piVar3,piVar3 + 8);
    for (local_70 = 0; (int)local_70 < 8; local_70 = local_70 + 1) {
      if (piVar3[(int)local_70] != local_70) {
        anon_unknown_0::Output
                  ("Data at index %d is %d should be %d.\n",(ulong)local_70,
                   (ulong)(uint)piVar3[(int)local_70],(ulong)local_70);
        _i_1 = (BasicAtomicCase1 *)&DAT_ffffffffffffffff;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    this_local = _i_1;
  }
  else {
    this_local = (BasicAtomicCase1 *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 8) in;" NL "layout(std430, binding = 0) buffer Output {" NL
			   "  uint g_add_output[8];" NL "  int g_sub_output[8];" NL "};" NL "shared uint g_add_value;" NL
			   "shared int g_sub_value;" NL "void main() {" NL "  if (gl_LocalInvocationIndex == 0u) {" NL
			   "    g_add_value = 0u;" NL "    g_sub_value = 7;" NL "  }" NL
			   "  g_add_output[gl_LocalInvocationIndex] = 0u;" NL "  g_sub_output[gl_LocalInvocationIndex] = 0;" NL
			   "  groupMemoryBarrier();" NL "  barrier();" NL
			   "  g_add_output[gl_LocalInvocationIndex] = atomicAdd(g_add_value, 1u);" NL
			   "  g_sub_output[gl_LocalInvocationIndex] = atomicAdd(g_sub_value, -1);" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 16 * sizeof(int), NULL, GL_STATIC_DRAW);

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		int* data;
		data = static_cast<int*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int) * 8, GL_MAP_READ_BIT));
		std::sort(data, data + 8);
		long error = NO_ERROR;
		for (int i = 0; i < 8; ++i)
		{
			if (data[i] != i)
			{
				Output("Data at index %d is %d should be %d.\n", i, data[i], i);
				error = ERROR;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		data = static_cast<int*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, sizeof(int) * 8, sizeof(int) * 8, GL_MAP_READ_BIT));
		std::sort(data, data + 8);
		for (int i = 0; i < 8; ++i)
		{
			if (data[i] != i)
			{
				Output("Data at index %d is %d should be %d.\n", i, data[i], i);
				error = ERROR;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return error;
	}